

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_FormatUnsignedChar_Test::TestBody(FormatterTest_FormatUnsignedChar_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  char (*in_stack_ffffffffffffff38) [3];
  string *expected;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int line;
  string *file;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  string local_90 [32];
  AssertionResult local_70;
  Message *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  string local_38 [32];
  AssertionResult local_18;
  
  file = local_38;
  fmt::v5::format<char[3],unsigned_char>
            ((char (*) [3])CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             (uchar *)in_stack_ffffffffffffff60);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x170dcb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x170e1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x170e71);
  expected = local_90;
  fmt::v5::format<char[3],unsigned_char>
            ((char (*) [3])CONCAT17(0x2a,in_stack_ffffffffffffff68),
             (uchar *)in_stack_ffffffffffffff60);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
             (char (*) [3])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::AssertionResult::failure_message((AssertionResult *)0x170f44);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x170f90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x170fdc);
  return;
}

Assistant:

TEST(FormatterTest, FormatUnsignedChar) {
  EXPECT_EQ("42", format("{}", static_cast<unsigned char>(42)));
  EXPECT_EQ("42", format("{}", static_cast<uint8_t>(42)));
}